

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

uint32_t lj_tab_keyindex(GCtab *t,cTValue *key)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  Node *local_40;
  Node *n;
  int32_t k;
  lua_Number nk;
  TValue tmp;
  cTValue *key_local;
  GCtab *t_local;
  
  if ((uint)((int)(key->field_4).it >> 0xf) < 0xfffffff2) {
    dVar1 = key->n;
    uVar2 = (uint)dVar1;
    if (uVar2 < t->asize) {
      if ((dVar1 == (double)(int)uVar2) && (!NAN(dVar1) && !NAN((double)(int)uVar2))) {
        return uVar2 + 1;
      }
    }
  }
  if (key->u64 == 0xffffffffffffffff) {
    t_local._4_4_ = 0;
  }
  else {
    local_40 = hashkey(t,key);
    do {
      iVar3 = lj_obj_equal(&local_40->key,key);
      if (iVar3 != 0) {
        return t->asize + (int)((long)((long)local_40 + (0x18 - (t->node).ptr64)) / 0x18);
      }
      local_40 = (Node *)(local_40->next).ptr64;
    } while (local_40 != (Node *)0x0);
    if ((key->field_4).it == 0xfffe7fff) {
      t_local._4_4_ = (key->u32).lo;
    }
    else {
      t_local._4_4_ = 0xffffffff;
    }
  }
  return t_local._4_4_;
}

Assistant:

uint32_t LJ_FASTCALL lj_tab_keyindex(GCtab *t, cTValue *key)
{
  TValue tmp;
  if (tvisint(key)) {
    int32_t k = intV(key);
    if ((uint32_t)k < t->asize)
      return (uint32_t)k + 1;
    setnumV(&tmp, (lua_Number)k);
    key = &tmp;
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if ((uint32_t)k < t->asize && nk == (lua_Number)k)
      return (uint32_t)k + 1;
  }
  if (!tvisnil(key)) {
    Node *n = hashkey(t, key);
    do {
      if (lj_obj_equal(&n->key, key))
	return t->asize + (uint32_t)((n+1) - noderef(t->node));
    } while ((n = nextnode(n)));
    if (key->u32.hi == LJ_KEYINDEX)  /* Despecialized ITERN while running. */
      return key->u32.lo;
    return ~0u;  /* Invalid key to next. */
  }
  return 0;  /* A nil key starts the traversal. */
}